

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

void If_Dec6Verify(word t,word z)

{
  word r;
  word t_local;
  
  t_local = t;
  r = If_Dec6Truth(z);
  if (r != t) {
    If_DecPrintConfig(z);
    Kit_DsdPrintFromTruth((uint *)&t_local,6);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&r,6);
    putchar(10);
    puts("Verification failed!");
  }
  return;
}

Assistant:

void If_Dec6Verify( word t, word z )
{
    word r = If_Dec6Truth( z );
    if ( r != t )
    {
        If_DecPrintConfig( z );
        Kit_DsdPrintFromTruth( (unsigned*)&t, 6 ); printf( "\n" );
//        Kit_DsdPrintFromTruth( (unsigned*)&q, 6 ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&r, 6 ); printf( "\n" );
        printf( "Verification failed!\n" );
    }
}